

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

longlong NULLCFile::FileSize(File *file)

{
  long __off;
  long lVar1;
  char *error;
  
  if (file == (File *)0x0) {
    error = "ERROR: null pointer access";
  }
  else {
    if ((FILE *)file->handle != (FILE *)0x0) {
      __off = ftell((FILE *)file->handle);
      fseek((FILE *)file->handle,0,2);
      lVar1 = ftell((FILE *)file->handle);
      fseek((FILE *)file->handle,__off,0);
      return lVar1;
    }
    error = "Cannot get size of a closed file.";
  }
  nullcThrowError(error);
  return 0;
}

Assistant:

long long FileSize(File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot get size of a closed file.");
			return 0;
		}

		long pos = ftell(file->handle);
		fseek(file->handle, 0, SEEK_END);
		long res = ftell(file->handle);
		fseek(file->handle, pos, SEEK_SET);

		return res;
	}